

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O1

int u8_strlen(char *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  iVar1 = 0;
  do {
    iVar3 = iVar1;
    iVar2 = (int)lVar4;
    lVar4 = (long)iVar2 + 1;
    iVar1 = iVar3 + 1;
  } while (s[iVar2] != '\0');
  return iVar3;
}

Assistant:

int u8_strlen(const char *s)
{
    int count = 0;
    int i = 0;

    while (u8_nextchar(s, &i) != 0)
        count++;

    return count;
}